

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O3

bool timeoffsets_tests::IsWarningRaised
               (vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                *check_offsets)

{
  pointer pdVar1;
  bool bVar2;
  const_iterator __end1;
  const_iterator __begin1;
  pointer pdVar3;
  long in_FS_OFFSET;
  TimeOffsets offsets;
  Warnings warnings;
  __native_type local_108;
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  _Stack_e0;
  Warnings *local_90;
  Warnings local_88;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  ::node::Warnings::Warnings(&local_88);
  _Stack_e0._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_map_size = 0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_108.__data.__list.__next = (__pthread_internal_list *)0x0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_108._16_8_ = 0;
  local_108.__data.__list.__prev = (__pthread_internal_list *)0x0;
  local_108.__align = 0;
  local_108._8_8_ = 0;
  _Stack_e0._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::_M_initialize_map(&_Stack_e0,0);
  pdVar1 = (check_offsets->
           super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_90 = &local_88;
  for (pdVar3 = (check_offsets->
                super__Vector_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    TimeOffsets::Add((TimeOffsets *)&local_108.__data,(seconds)pdVar3->__r);
  }
  bVar2 = TimeOffsets::WarnIfOutOfSync((TimeOffsets *)&local_108.__data);
  std::
  _Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::~_Deque_base(&_Stack_e0);
  std::
  _Rb_tree<std::variant<kernel::Warning,_node::Warning>,_std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>,_std::_Select1st<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>,_std::less<std::variant<kernel::Warning,_node::Warning>_>,_std::allocator<std::pair<const_std::variant<kernel::Warning,_node::Warning>,_bilingual_str>_>_>
  ::~_Rb_tree(&local_88.m_warnings._M_t);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

static bool IsWarningRaised(const std::vector<std::chrono::seconds>& check_offsets)
{
    node::Warnings warnings{};
    TimeOffsets offsets{warnings};
    AddMulti(offsets, check_offsets);
    return offsets.WarnIfOutOfSync();
}